

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bswap.h
# Opt level: O0

int ldl_he_p(void *ptr)

{
  int32_t r;
  void *ptr_local;
  
  return *ptr;
}

Assistant:

static inline int ldl_he_p(const void *ptr)
{
    int32_t r;
#ifdef _MSC_VER
    memcpy(&r, ptr, sizeof(r));
#else
    __builtin_memcpy(&r, ptr, sizeof(r));
#endif
    return r;
}